

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetInitialState
          (DiscreteKalmanFilterHelper *this,VectorDynSize *x0)

{
  long lVar1;
  long lVar2;
  VectorDynSize *pVVar3;
  VectorDynSize *in_RSI;
  long *in_RDI;
  
  lVar2 = iDynTree::VectorDynSize::size();
  lVar1 = *in_RDI;
  if (lVar2 == lVar1) {
    pVVar3 = (VectorDynSize *)
             iDynTree::VectorDynSize::operator=((VectorDynSize *)(in_RDI + 7),in_RSI);
    iDynTree::VectorDynSize::operator=((VectorDynSize *)(in_RDI + 3),pVVar3);
    *(undefined1 *)((long)in_RDI + 0x1da) = 1;
  }
  else {
    iDynTree::reportError
              ("DiscreteKalmanFilterHelper","kfSetInitialState",
               "Could not set KF initial state - dimension mismatch");
  }
  return lVar2 == lVar1;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetInitialState(const iDynTree::VectorDynSize& x0)
{
    if (x0.size() != m_dim_X)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetInitialState", "Could not set KF initial state - dimension mismatch");
        return false;
    }

    m_x = m_x0 = x0;
    m_initial_state_set = true;
    return true;
}